

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O0

void PMurHash32_Process(uint32_t *ph1,uint32_t *pcarry,void *key,int len)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uchar *puVar4;
  int local_60;
  int _i_1;
  uint32_t k1_3;
  uint32_t k1_2;
  uint32_t k1_1;
  uint32_t k1;
  int _i;
  int i;
  int n;
  uchar *end;
  uchar *ptr;
  uint local_28;
  uint32_t c;
  uint32_t h1;
  int len_local;
  void *key_local;
  uint32_t *pcarry_local;
  uint32_t *ph1_local;
  
  local_28 = *ph1;
  ptr._4_4_ = *pcarry;
  _i = ptr._4_4_ & 3;
  k1_1 = -(int)key & 3;
  end = (uchar *)key;
  c = len;
  if ((k1_1 != 0) && ((int)k1_1 <= len)) {
    while (uVar2 = k1_1 - 1, k1_1 != 0) {
      uVar1 = ptr._4_4_ >> 8;
      puVar4 = end + 1;
      ptr._4_4_ = uVar1 | (uint)*end << 0x18;
      _i = _i + 1;
      c = c - 1;
      k1_1 = uVar2;
      end = puVar4;
      if (_i == 4) {
        ptr._4_4_ = (uVar1 * 0x16a88000 | ptr._4_4_ * -0x3361d2af >> 0x11) * 0x1b873593;
        local_28 = ((ptr._4_4_ ^ local_28) << 0xd | (ptr._4_4_ ^ local_28) >> 0x13) * 5 + 0xe6546b64
        ;
        _i = 0;
      }
    }
  }
  uVar2 = c;
  if ((int)c < 0) {
    uVar2 = c + 3;
  }
  puVar4 = end + (int)(uVar2 & 0xfffffffc);
  switch(_i) {
  case 0:
    for (; end < puVar4; end = end + 4) {
      uVar1 = (*(int *)end * 0x16a88000 | (uint)(*(int *)end * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              local_28;
      local_28 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
    break;
  case 1:
    for (; end < puVar4; end = end + 4) {
      uVar1 = ptr._4_4_ >> 0x18;
      ptr._4_4_ = *(uint *)end;
      uVar1 = ptr._4_4_ << 8 | uVar1;
      uVar1 = (uVar1 * 0x16a88000 | uVar1 * -0x3361d2af >> 0x11) * 0x1b873593 ^ local_28;
      local_28 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
    break;
  case 2:
    for (; end < puVar4; end = end + 4) {
      uVar1 = ptr._4_4_ >> 0x10;
      ptr._4_4_ = *(uint *)end;
      uVar1 = ptr._4_4_ << 0x10 | uVar1;
      uVar1 = (uVar1 * 0x16a88000 | uVar1 * -0x3361d2af >> 0x11) * 0x1b873593 ^ local_28;
      local_28 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
    break;
  case 3:
    for (; end < puVar4; end = end + 4) {
      uVar1 = ptr._4_4_ >> 8;
      ptr._4_4_ = *(uint *)end;
      uVar1 = (uVar1 * 0x16a88000 | (ptr._4_4_ << 0x18 | uVar1) * -0x3361d2af >> 0x11) * 0x1b873593
              ^ local_28;
      local_28 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
  }
  local_60 = (int)c % 4;
  while (iVar3 = local_60 + -1, local_60 != 0) {
    uVar1 = ptr._4_4_ >> 8;
    puVar4 = end + 1;
    ptr._4_4_ = uVar1 | (uint)*end << 0x18;
    _i = _i + 1;
    local_60 = iVar3;
    end = puVar4;
    if (_i == 4) {
      ptr._4_4_ = (uVar1 * 0x16a88000 | ptr._4_4_ * -0x3361d2af >> 0x11) * 0x1b873593;
      local_28 = ((ptr._4_4_ ^ local_28) << 0xd | (ptr._4_4_ ^ local_28) >> 0x13) * 5 + 0xe6546b64;
      _i = 0;
    }
  }
  *ph1 = local_28;
  *pcarry = ptr._4_4_ & 0xffffff00 | _i;
  return;
}

Assistant:

void PMurHash32_Process(uint32_t *ph1, uint32_t *pcarry, const void *key, int len)
{
  uint32_t h1 = *ph1;
  uint32_t c = *pcarry;

  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end;

  /* Extract carry count from low 2 bits of c value */
  int n = c & 3;

#if defined(UNALIGNED_SAFE)
  /* This CPU handles unaligned word access */

  /* Consume any carry bytes */
  int i = (4-n) & 3;
  if(i && i <= len) {
    DOBYTES(i, h1, c, n, ptr, len);
  }

  /* Process 32-bit chunks */
  end = ptr + len/4*4;
  for( ; ptr < end ; ptr+=4) {
    uint32_t k1 = READ_UINT32(ptr);
    DOBLOCK(h1, k1);
  }

#else /*UNALIGNED_SAFE*/
  /* This CPU does not handle unaligned word access */

  /* Consume enough so that the next data byte is word aligned */
  int i = -(long)ptr & 3;
  if(i && i <= len) {
      DOBYTES(i, h1, c, n, ptr, len);
  }

  /* We're now aligned. Process in aligned blocks. Specialise for each possible carry count */
  end = ptr + len/4*4;
  switch(n) { /* how many bytes in c */
  case 0: /* c=[----]  w=[3210]  b=[3210]=w            c'=[----] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = READ_UINT32(ptr);
      DOBLOCK(h1, k1);
    }
    break;
  case 1: /* c=[0---]  w=[4321]  b=[3210]=c>>24|w<<8   c'=[4---] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>24;
      c = READ_UINT32(ptr);
      k1 |= c<<8;
      DOBLOCK(h1, k1);
    }
    break;
  case 2: /* c=[10--]  w=[5432]  b=[3210]=c>>16|w<<16  c'=[54--] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>16;
      c = READ_UINT32(ptr);
      k1 |= c<<16;
      DOBLOCK(h1, k1);
    }
    break;
  case 3: /* c=[210-]  w=[6543]  b=[3210]=c>>8|w<<24   c'=[654-] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>8;
      c = READ_UINT32(ptr);
      k1 |= c<<24;
      DOBLOCK(h1, k1);
    }
  }
#endif /*UNALIGNED_SAFE*/

  /* Advance over whole 32-bit chunks, possibly leaving 1..3 bytes */
  len -= len/4*4;

  /* Append any remaining bytes into carry */
  DOBYTES(len, h1, c, n, ptr, len);

  /* Copy out new running hash and carry */
  *ph1 = h1;
  *pcarry = (c & ~0xff) | n;
}